

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TexImageCubeAlignCase::createTexture(TexImageCubeAlignCase *this)

{
  ContextWrapper *this_00;
  TextureFormatInfo *b;
  int iVar1;
  int iVar2;
  int ndx;
  int level;
  uint width;
  uint rowPitch;
  long lVar3;
  deUint32 tex;
  TextureFormat *local_c8;
  Vec4 *local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  Vector<float,_4> local_98;
  Vec4 colorB;
  PixelBufferAccess local_78;
  Vector<float,_4> local_50;
  Vec4 colorA;
  
  tex = 0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,this->m_alignment);
  local_c8 = &(this->super_TextureCubeSpecCase).m_texFormat;
  b = &(this->super_TextureCubeSpecCase).m_texFormatInfo;
  local_c0 = &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax;
  for (level = 0; level < (this->super_TextureCubeSpecCase).m_numLevels; level = level + 1) {
    width = (this->super_TextureCubeSpecCase).m_size >> ((byte)level & 0x1f);
    if ((int)width < 2) {
      width = 1;
    }
    iVar2 = tcu::TextureFormat::getPixelSize(local_c8);
    iVar1 = this->m_alignment;
    colorB.m_data[0] = 1.0;
    colorB.m_data[1] = 0.0;
    colorB.m_data[2] = 0.0;
    colorB.m_data[3] = 1.0;
    tcu::operator-((tcu *)&local_98,local_c0,&b->valueMin);
    tcu::operator*((tcu *)&local_78,&colorB,&local_98);
    tcu::operator+((tcu *)&colorA,(Vector<float,_4> *)&local_78,&b->valueMin);
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 1.0;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 1.0;
    tcu::operator-((tcu *)&local_50,local_c0,&b->valueMin);
    tcu::operator*((tcu *)&local_78,&local_98,&local_50);
    tcu::operator+((tcu *)&colorB,(Vector<float,_4> *)&local_78,&b->valueMin);
    rowPitch = -iVar1 & (iVar2 * width + iVar1) - 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&data,(long)(int)(rowPitch * width));
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_78,local_c8,width,width,1,rowPitch,0,
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    tcu::fillWithGrid(&local_78,(width >> 2) + (uint)(width >> 2 == 0),&colorA,&colorB);
    for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 4) {
      sglr::ContextWrapper::glTexImage2D
                (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar3),level,this->m_internalFormat,
                 width,width,0,this->m_format,this->m_dataType,
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		vector<deUint8>		data;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelSize	= de::max(1, m_size >> ndx);
			int		rowPitch	= deAlign32(m_texFormat.getPixelSize()*levelSize, m_alignment);
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			int		cellSize	= de::max(1, levelSize >> 2);

			data.resize(rowPitch*levelSize);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, levelSize, levelSize, 1, rowPitch, 0, &data[0]), cellSize, colorA, colorB);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
				glTexImage2D(s_cubeMapFaces[face], ndx, m_internalFormat, levelSize, levelSize, 0, m_format, m_dataType, &data[0]);
		}
	}